

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void __thiscall idx2::free_list_allocator::DeallocAll(free_list_allocator *this)

{
  node *pnVar1;
  buffer Buf;
  node *local_30;
  i64 local_28;
  allocator *local_20;
  
  local_30 = this->Head;
  while (local_30 != (node *)0x0) {
    pnVar1 = local_30->Next;
    local_28 = this->MaxBytes;
    local_20 = this->Parent;
    (*local_20->_vptr_allocator[1])(local_20,&local_30);
    this->Head = pnVar1;
    local_30 = pnVar1;
  }
  return;
}

Assistant:

void
free_list_allocator::DeallocAll()
{
  idx2_Assert(Parent);
  while (Head)
  {
    node* Next = Head->Next;
    buffer Buf((byte*)Head, MaxBytes, Parent);
    Parent->Dealloc(&Buf);
    Head = Next;
  }
}